

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

size_t __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  void *pvVar1;
  Rep *pRVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  
  pvVar1 = this->tagged_rep_or_elem_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = (long)this->capacity_proxy_ * 8 + 0x10;
  }
  if (((ulong)pvVar1 & 1) == 0) {
    uVar4 = (uint)(pvVar1 != (void *)0x0);
  }
  else {
    pRVar2 = rep(this);
    uVar4 = pRVar2->allocated_size;
  }
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = rep(this);
    this = (RepeatedPtrFieldBase *)pRVar2->elements;
  }
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      sVar3 = StringSpaceUsedExcludingSelfLong((string *)(&this->tagged_rep_or_elem_)[uVar5]);
      sVar6 = sVar6 + sVar3 + 0x20;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return sVar6;
}

Assistant:

PROTOBUF_NOINLINE size_t SpaceUsedExcludingSelfLong() const {
    size_t allocated_bytes =
        using_sso()
            ? 0
            : static_cast<size_t>(Capacity()) * sizeof(void*) + kRepHeaderSize;
    const int n = allocated_size();
    void* const* elems = elements();
    for (int i = 0; i < n; ++i) {
      allocated_bytes +=
          TypeHandler::SpaceUsedLong(*cast<TypeHandler>(elems[i]));
    }
    return allocated_bytes;
  }